

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_changeWindowScale(void)

{
  double dVar1;
  
  if (am_zoomdir <= 0.0) {
    if (0.0 <= am_zoomdir) {
      if (Button_AM_ZoomIn.bDown == '\0') {
        dVar1 = *(double *)(&DAT_005e6b90 + (ulong)(Button_AM_ZoomOut.bDown == '\0') * 8);
      }
      else {
        dVar1 = 1.02;
      }
    }
    else {
      dVar1 = -0.9803921568627451 / am_zoomdir;
    }
  }
  else {
    dVar1 = am_zoomdir * 1.02;
  }
  am_zoomdir = 0.0;
  scale_mtof = dVar1 * scale_mtof;
  dVar1 = min_scale_mtof;
  if ((scale_mtof < min_scale_mtof) || (dVar1 = max_scale_mtof, max_scale_mtof < scale_mtof)) {
    scale_mtof = dVar1;
  }
  scale_ftom = 1.0 / scale_mtof;
  return;
}

Assistant:

void AM_changeWindowScale ()
{
	double mtof_zoommul;

	if (am_zoomdir > 0)
	{
		mtof_zoommul = M_ZOOMIN * am_zoomdir;
	}
	else if (am_zoomdir < 0)
	{
		mtof_zoommul = M_ZOOMOUT / -am_zoomdir;
	}
	else if (Button_AM_ZoomIn.bDown)
	{
		mtof_zoommul = M_ZOOMIN;
	}
	else if (Button_AM_ZoomOut.bDown)
	{
		mtof_zoommul = M_ZOOMOUT;
	}
	else
	{
		mtof_zoommul = 1;
	}
	am_zoomdir = 0;

	// Change the scaling multipliers
	scale_mtof = scale_mtof * mtof_zoommul;
	scale_ftom = 1 / scale_mtof;

	if (scale_mtof < min_scale_mtof)
		AM_minOutWindowScale();
	else if (scale_mtof > max_scale_mtof)
		AM_maxOutWindowScale();
}